

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O1

bool __thiscall flexbuffers::Reference::MutateInt(Reference *this,int64_t i)

{
  ulong uVar1;
  ulong *puVar2;
  uint8_t *__dest;
  byte bVar3;
  ulong uVar4;
  size_t __n;
  bool bVar5;
  bool bVar6;
  int64_t local_10;
  
  bVar5 = false;
  if (6 < this->type_ - FBT_INT) {
    return false;
  }
  switch(this->type_) {
  case FBT_INT:
    __n = (size_t)this->parent_width_;
    uVar1 = i >> 0x3f ^ i * 2;
    if (uVar1 < 0x100) {
LAB_0015fb96:
      bVar3 = 0;
    }
    else {
      bVar3 = 1;
      if (0xffff < uVar1) {
LAB_0015fbd2:
        bVar3 = 3 - (uVar1 >> 0x20 == 0);
      }
    }
    break;
  case FBT_UINT:
    __n = (size_t)this->parent_width_;
    if ((ulong)i < 0x100) goto LAB_0015fb96;
    bVar3 = 1;
    uVar1 = i;
    if (0xffff < (ulong)i) goto LAB_0015fbd2;
    break;
  default:
    goto switchD_0015fb41_caseD_3;
  case FBT_INDIRECT_INT:
    puVar2 = (ulong *)this->data_;
    bVar3 = this->parent_width_;
    if (bVar3 < 4) {
      if (bVar3 < 2) {
        uVar1 = (ulong)(byte)*puVar2;
      }
      else {
        uVar1 = (ulong)(ushort)*puVar2;
      }
    }
    else if (bVar3 < 8) {
      uVar1 = (ulong)(uint)*puVar2;
    }
    else {
      uVar1 = *puVar2;
    }
    __n = (size_t)this->byte_width_;
    uVar4 = i >> 0x3f ^ i * 2;
    if (uVar4 < 0x100) {
LAB_0015fc69:
      bVar3 = 0;
    }
    else {
      bVar3 = 1;
      if (0xffff < uVar4) {
        uVar4 = uVar4 >> 0x20;
LAB_0015fc86:
        bVar3 = 3 - (uVar4 == 0);
      }
    }
    goto LAB_0015fc8f;
  case FBT_INDIRECT_UINT:
    puVar2 = (ulong *)this->data_;
    bVar3 = this->parent_width_;
    if (bVar3 < 4) {
      if (bVar3 < 2) {
        uVar1 = (ulong)(byte)*puVar2;
      }
      else {
        uVar1 = (ulong)(ushort)*puVar2;
      }
    }
    else if (bVar3 < 8) {
      uVar1 = (ulong)(uint)*puVar2;
    }
    else {
      uVar1 = *puVar2;
    }
    __n = (size_t)this->byte_width_;
    if ((ulong)i < 0x100) goto LAB_0015fc69;
    bVar3 = 1;
    if (0xffff < (ulong)i) {
      uVar4 = (ulong)i >> 0x20;
      goto LAB_0015fc86;
    }
LAB_0015fc8f:
    bVar6 = __n >> (bVar3 & 0x3f) == 0;
    bVar5 = !bVar6;
    if (bVar6) {
      return bVar5;
    }
    __dest = (uint8_t *)((long)puVar2 - uVar1);
    goto LAB_0015fcb3;
  }
  __dest = this->data_;
  bVar5 = __n >> (bVar3 & 0x3f) != 0;
  if (bVar5) {
LAB_0015fcb3:
    local_10 = i;
    memcpy(__dest,&local_10,__n);
  }
switchD_0015fb41_caseD_3:
  return bVar5;
}

Assistant:

bool MutateInt(int64_t i) {
    if (type_ == FBT_INT) {
      return Mutate(data_, i, parent_width_, WidthI(i));
    } else if (type_ == FBT_INDIRECT_INT) {
      return Mutate(Indirect(), i, byte_width_, WidthI(i));
    } else if (type_ == FBT_UINT) {
      auto u = static_cast<uint64_t>(i);
      return Mutate(data_, u, parent_width_, WidthU(u));
    } else if (type_ == FBT_INDIRECT_UINT) {
      auto u = static_cast<uint64_t>(i);
      return Mutate(Indirect(), u, byte_width_, WidthU(u));
    } else {
      return false;
    }
  }